

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QCursor>::emplace<QCursor_const&>
          (QMovableArrayOps<QCursor> *this,qsizetype i,QCursor *args)

{
  qsizetype *pqVar1;
  QCursor **ppQVar2;
  long lVar3;
  Data *pDVar4;
  QCursor *pQVar5;
  QCursor QVar6;
  qsizetype qVar7;
  long in_FS_OFFSET;
  bool bVar8;
  Inserter IStack_58;
  QCursor tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.size == i) {
      qVar7 = QArrayDataPointer<QCursor>::freeSpaceAtEnd((QArrayDataPointer<QCursor> *)this);
      if (qVar7 == 0) goto LAB_002b95de;
      QCursor::QCursor((this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr
                       + (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.
                         size,args);
LAB_002b96ce:
      pqVar1 = &(this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.size;
      *pqVar1 = *pqVar1 + 1;
      goto LAB_002b968d;
    }
LAB_002b95de:
    if (i == 0) {
      qVar7 = QArrayDataPointer<QCursor>::freeSpaceAtBegin((QArrayDataPointer<QCursor> *)this);
      if (qVar7 != 0) {
        QCursor::QCursor((this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.
                         ptr + -1,args);
        ppQVar2 = &(this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr;
        *ppQVar2 = *ppQVar2 + -1;
        goto LAB_002b96ce;
      }
    }
  }
  tmp.d = (QCursorData *)&DAT_aaaaaaaaaaaaaaaa;
  QCursor::QCursor(&tmp,args);
  bVar8 = (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.size != 0;
  QArrayDataPointer<QCursor>::detachAndGrow
            ((QArrayDataPointer<QCursor> *)this,(uint)(i == 0 && bVar8),1,(QCursor **)0x0,
             (QArrayDataPointer<QCursor> *)0x0);
  QVar6 = tmp;
  if (i == 0 && bVar8) {
    pQVar5 = (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr;
    tmp.d = (QCursorData *)0x0;
    pQVar5[-1].d = QVar6.d;
    (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr = pQVar5 + -1;
    pqVar1 = &(this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    Inserter::Inserter(&IStack_58,(QArrayDataPointer<QCursor> *)this,i,1);
    QVar6 = tmp;
    tmp.d = (QCursorData *)0x0;
    (IStack_58.displaceFrom)->d = QVar6.d;
    IStack_58.displaceFrom = IStack_58.displaceFrom + 1;
    Inserter::~Inserter(&IStack_58);
  }
  QCursor::~QCursor(&tmp);
LAB_002b968d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }